

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int mz_deflate(mz_streamp pStream,int flush)

{
  uint uVar1;
  uint uVar2;
  tdefl_flush flush_00;
  tdefl_status tVar3;
  int iVar4;
  uchar *pOut_buf;
  mz_ulong mVar5;
  uchar *pIn_buf;
  tdefl_compressor *d;
  uint uVar6;
  uint uVar7;
  mz_ulong mVar8;
  size_t out_bytes;
  size_t in_bytes;
  mz_ulong local_40;
  mz_ulong local_38;
  
  if (((pStream == (mz_streamp)0x0) ||
      (d = (tdefl_compressor *)pStream->state, 4 < (uint)flush || d == (tdefl_compressor *)0x0)) ||
     (pOut_buf = pStream->next_out, pOut_buf == (uchar *)0x0)) {
LAB_001320a8:
    iVar4 = -2;
  }
  else {
    uVar7 = pStream->avail_out;
    if (uVar7 == 0) {
      iVar4 = -5;
    }
    else {
      flush_00 = TDEFL_SYNC_FLUSH;
      if (flush != 1) {
        flush_00 = flush;
      }
      if (d->m_prev_return_status == TDEFL_STATUS_DONE) {
        iVar4 = -5;
        if (flush_00 == TDEFL_FINISH) {
          iVar4 = 1;
        }
      }
      else {
        local_40 = pStream->total_in;
        local_38 = pStream->total_out;
        uVar6 = pStream->avail_in;
        pIn_buf = pStream->next_in;
        do {
          in_bytes = (size_t)uVar6;
          out_bytes = (size_t)uVar7;
          tVar3 = tdefl_compress(d,pIn_buf,&in_bytes,pOut_buf,&out_bytes,flush_00);
          pIn_buf = pStream->next_in + (in_bytes & 0xffffffff);
          pStream->next_in = pIn_buf;
          uVar1 = pStream->avail_in;
          uVar2 = pStream->avail_out;
          uVar6 = uVar1 - (uint)in_bytes;
          pStream->avail_in = uVar6;
          mVar5 = (in_bytes & 0xffffffff) + pStream->total_in;
          pStream->total_in = mVar5;
          d = (tdefl_compressor *)pStream->state;
          pStream->adler = (ulong)d->m_adler32;
          pOut_buf = pStream->next_out + (out_bytes & 0xffffffff);
          pStream->next_out = pOut_buf;
          uVar7 = uVar2 - (uint)out_bytes;
          pStream->avail_out = uVar7;
          mVar8 = (out_bytes & 0xffffffff) + pStream->total_out;
          pStream->total_out = mVar8;
          if (tVar3 < TDEFL_STATUS_OKAY) goto LAB_001320a8;
          if (tVar3 == TDEFL_STATUS_DONE) {
            return 1;
          }
          if (uVar2 == (uint)out_bytes) {
            return 0;
          }
        } while (uVar1 != (uint)in_bytes || flush_00 == TDEFL_FINISH);
        iVar4 = 0;
        if (flush_00 == TDEFL_NO_FLUSH) {
          iVar4 = (uint)(mVar8 != local_38 || mVar5 != local_40) * 5 + -5;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int mz_deflate(mz_streamp pStream, int flush) {
  size_t in_bytes, out_bytes;
  mz_ulong orig_total_in, orig_total_out;
  int mz_status = MZ_OK;

  if ((!pStream) || (!pStream->state) || (flush < 0) || (flush > MZ_FINISH) ||
      (!pStream->next_out))
    return MZ_STREAM_ERROR;
  if (!pStream->avail_out)
    return MZ_BUF_ERROR;

  if (flush == MZ_PARTIAL_FLUSH)
    flush = MZ_SYNC_FLUSH;

  if (((tdefl_compressor *)pStream->state)->m_prev_return_status ==
      TDEFL_STATUS_DONE)
    return (flush == MZ_FINISH) ? MZ_STREAM_END : MZ_BUF_ERROR;

  orig_total_in = pStream->total_in;
  orig_total_out = pStream->total_out;
  for (;;) {
    tdefl_status defl_status;
    in_bytes = pStream->avail_in;
    out_bytes = pStream->avail_out;

    defl_status = tdefl_compress((tdefl_compressor *)pStream->state,
                                 pStream->next_in, &in_bytes, pStream->next_out,
                                 &out_bytes, (tdefl_flush)flush);
    pStream->next_in += (mz_uint)in_bytes;
    pStream->avail_in -= (mz_uint)in_bytes;
    pStream->total_in += (mz_uint)in_bytes;
    pStream->adler = tdefl_get_adler32((tdefl_compressor *)pStream->state);

    pStream->next_out += (mz_uint)out_bytes;
    pStream->avail_out -= (mz_uint)out_bytes;
    pStream->total_out += (mz_uint)out_bytes;

    if (defl_status < 0) {
      mz_status = MZ_STREAM_ERROR;
      break;
    } else if (defl_status == TDEFL_STATUS_DONE) {
      mz_status = MZ_STREAM_END;
      break;
    } else if (!pStream->avail_out)
      break;
    else if ((!pStream->avail_in) && (flush != MZ_FINISH)) {
      if ((flush) || (pStream->total_in != orig_total_in) ||
          (pStream->total_out != orig_total_out))
        break;
      return MZ_BUF_ERROR; // Can't make forward progress without some input.
    }
  }
  return mz_status;
}